

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pending_with_parameters.cpp
# Opt level: O0

void CreateSimpleTable(Connection *con)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<bool> EVar1;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffe18;
  Flags in_stack_fffffffffffffe1c;
  AssertionHandler *in_stack_fffffffffffffe20;
  AssertionHandler *pAVar2;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  AssertionHandler *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  size_type in_stack_fffffffffffffe40;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffe48;
  AssertionHandler *this;
  allocator local_181;
  string local_180 [32];
  string local_160 [8];
  undefined1 local_158 [48];
  StringRef local_128;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [8];
  undefined1 local_90 [144];
  
  local_90._48_16_ =
       (undefined1  [16])
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffe20,
                  CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)(local_90 + 0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
             ,8);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffe30,
             (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  capturedExpression.m_size = in_stack_fffffffffffffe40;
  capturedExpression.m_start = in_stack_fffffffffffffe38;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe30,
             (StringRef *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (SourceLineInfo *)in_stack_fffffffffffffe20,capturedExpression,
             in_stack_fffffffffffffe1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"CREATE TABLE a (i TINYINT)",&local_b9);
  duckdb::Connection::Query(local_98);
  this = (AssertionHandler *)local_90;
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffffe20,
             (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
              *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *
                  )0x62ed6c);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     false);
  local_90[0xf] = EVar1;
  Catch::AssertionHandler::handleExpr<bool>
            (this,(ExprLhs<bool> *)CONCAT17(EVar1.m_lhs,in_stack_fffffffffffffe48));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x62edbe);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x62edcb);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe20);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe20);
  local_128 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffe20,
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  pAVar2 = (AssertionHandler *)(local_158 + 0x20);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)pAVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
             ,9);
  Catch::StringRef::StringRef
            ((StringRef *)pAVar2,
             (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  capturedExpression_00.m_size = in_stack_fffffffffffffe40;
  capturedExpression_00.m_start = in_stack_fffffffffffffe38;
  Catch::AssertionHandler::AssertionHandler
            (pAVar2,(StringRef *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (SourceLineInfo *)in_stack_fffffffffffffe20,capturedExpression_00,
             in_stack_fffffffffffffe1c);
  paVar3 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"INSERT INTO a VALUES (11), (12), (13)",paVar3);
  duckdb::Connection::Query(local_160);
  pAVar2 = (AssertionHandler *)local_158;
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             pAVar2,(unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
                     *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *
                  )0x62ef95);
  local_158[0xf] =
       Catch::Decomposer::operator<=
                 ((Decomposer *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),false)
  ;
  Catch::AssertionHandler::handleExpr<bool>
            (this,(ExprLhs<bool> *)CONCAT17(EVar1.m_lhs,in_stack_fffffffffffffe48));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x62efe7);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x62eff4);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  Catch::AssertionHandler::complete(pAVar2);
  Catch::AssertionHandler::~AssertionHandler(pAVar2);
  return;
}

Assistant:

static void CreateSimpleTable(Connection &con) {
	REQUIRE_NO_FAIL(con.Query("CREATE TABLE a (i TINYINT)"));
	REQUIRE_NO_FAIL(con.Query("INSERT INTO a VALUES (11), (12), (13)"));
}